

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::InputFile::rawTileData
          (InputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  element_type *peVar1;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  BaseExc *e;
  stringstream _iex_throw_s;
  char **in_stack_00000208;
  int *in_stack_00000210;
  int *in_stack_00000218;
  int *in_stack_00000220;
  int *in_stack_00000228;
  TiledInputFile *in_stack_00000230;
  int *in_stack_00000240;
  stringstream local_1c8 [16];
  ostream local_1b8 [440];
  
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f6425);
  if (peVar1->_storage != EXR_STORAGE_TILED) {
    peVar1 = std::
             __shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1f643d);
    if (peVar1->_storage != EXR_STORAGE_DEEP_TILED) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1c8);
      std::operator<<(local_1b8,"Tried to read a raw tile from a scanline-based image.");
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,local_1c8);
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  std::__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f65f1);
  std::unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
  operator->((unique_ptr<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *)
             0x1f65fd);
  TiledInputFile::rawTileData
            (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218,
             in_stack_00000210,in_stack_00000208,in_stack_00000240);
  return;
}

Assistant:

void
InputFile::rawTileData (
    int&         dx,
    int&         dy,
    int&         lx,
    int&         ly,
    const char*& pixelData,
    int&         pixelDataSize)
{
    try
    {
        if (_data->_storage != EXR_STORAGE_TILED &&
            _data->_storage != EXR_STORAGE_DEEP_TILED)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Tried to read a raw tile "
                "from a scanline-based image.");
        }

        _data->_tFile->rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading tile data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}